

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,double,duckdb::interval_t,duckdb::BinaryZeroIsNullWrapper,duckdb::DivideOperator,bool,false,false>
               (interval_t *ldata,double *rdata,interval_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  double dVar1;
  unsigned_long *puVar2;
  undefined8 uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  byte bVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  _Head_base<0UL,_unsigned_long_*,_false> _Var9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  idx_t idx_in_entry_1;
  int64_t iVar13;
  ulong uVar14;
  ulong uVar15;
  unsigned_long uVar16;
  ulong uVar17;
  ulong uVar18;
  idx_t idx_in_entry;
  ulong uVar19;
  interval_t left;
  interval_t left_00;
  interval_t left_01;
  interval_t iVar20;
  interval_t iVar21;
  interval_t iVar22;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  idx_t local_88;
  ulong local_80;
  idx_t local_78;
  interval_t *local_70;
  double *local_68;
  ulong local_60;
  ulong local_58;
  unsigned_long local_50;
  buffer_ptr<ValidityBuffer> *local_48;
  int64_t local_40;
  double *local_38;
  
  local_78 = count;
  local_70 = result_data;
  local_68 = rdata;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar12 = 1;
      uVar10 = 0;
      do {
        uVar3 = *(undefined8 *)((long)ldata + lVar12 * 8 + -8);
        iVar22.micros = *(int64_t *)(&ldata->months + lVar12 * 2);
        iVar22.months = (int)uVar3;
        iVar22.days = (int)((ulong)uVar3 >> 0x20);
        dVar1 = local_68[uVar10];
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          left_01.micros = *(int64_t *)(&ldata->months + lVar12 * 2);
          left_01.months = (int)uVar3;
          left_01.days = (int)((ulong)uVar3 >> 0x20);
          iVar22 = DivideOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                             (left_01,dVar1);
        }
        else {
          _Var9._M_head_impl = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (_Var9._M_head_impl == (unsigned_long *)0x0) {
            local_88 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_98,&local_88);
            p_Var7 = p_Stack_90;
            peVar6 = local_98;
            local_98 = (element_type *)0x0;
            p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar6;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var7;
            if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
               p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
            }
            pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                               (&(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
            _Var9._M_head_impl =
                 (pTVar8->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var9._M_head_impl;
            result_data = local_70;
          }
          bVar5 = (byte)uVar10 & 0x3f;
          _Var9._M_head_impl[uVar10 >> 6] =
               _Var9._M_head_impl[uVar10 >> 6] &
               (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
        }
        *(long *)((long)result_data + lVar12 * 8 + -8) = iVar22._0_8_;
        *(int64_t *)(&result_data->months + lVar12 * 2) = iVar22.micros;
        uVar10 = uVar10 + 1;
        lVar12 = lVar12 + 2;
      } while (local_78 != uVar10);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar10 = count + 0x3f >> 6;
    local_48 = &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    local_80 = 0;
    uVar19 = 0;
    local_60 = uVar10;
    do {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar14 = uVar19 + 0x40;
        if (count <= uVar19 + 0x40) {
          uVar14 = count;
        }
LAB_010bd6d8:
        uVar15 = uVar19;
        if (uVar19 < uVar14) {
          lVar12 = uVar19 * 2 + 1;
          do {
            uVar3 = *(undefined8 *)((long)ldata + lVar12 * 8 + -8);
            iVar21.micros = *(int64_t *)(&ldata->months + lVar12 * 2);
            iVar21.months = (int)uVar3;
            iVar21.days = (int)((ulong)uVar3 >> 0x20);
            dVar1 = local_68[uVar19];
            if ((dVar1 != 0.0) || (NAN(dVar1))) {
              left_00.micros = *(int64_t *)(&ldata->months + lVar12 * 2);
              left_00.months = (int)uVar3;
              left_00.days = (int)((ulong)uVar3 >> 0x20);
              iVar21 = DivideOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                                 (left_00,dVar1);
            }
            else {
              _Var9._M_head_impl = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (_Var9._M_head_impl == (unsigned_long *)0x0) {
                local_88 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_98,&local_88);
                p_Var7 = p_Stack_90;
                peVar6 = local_98;
                local_98 = (element_type *)0x0;
                p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = peVar6;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = p_Var7;
                if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
                   p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                }
                pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                   (local_48);
                _Var9._M_head_impl =
                     (pTVar8->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                     _Var9._M_head_impl;
                result_data = local_70;
              }
              bVar5 = (byte)uVar19 & 0x3f;
              _Var9._M_head_impl[uVar19 >> 6] =
                   _Var9._M_head_impl[uVar19 >> 6] &
                   (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
            }
            *(long *)((long)result_data + lVar12 * 8 + -8) = iVar21._0_8_;
            *(int64_t *)(&result_data->months + lVar12 * 2) = iVar21.micros;
            uVar19 = uVar19 + 1;
            lVar12 = lVar12 + 2;
            count = local_78;
            uVar10 = local_60;
            uVar15 = uVar14;
          } while (uVar14 != uVar19);
        }
      }
      else {
        uVar16 = puVar2[local_80];
        uVar14 = uVar19 + 0x40;
        if (count <= uVar19 + 0x40) {
          uVar14 = count;
        }
        uVar15 = uVar14;
        if (uVar16 != 0) {
          if (uVar16 == 0xffffffffffffffff) goto LAB_010bd6d8;
          uVar17 = uVar14 - uVar19;
          uVar15 = uVar19;
          if (uVar19 <= uVar14 && uVar17 != 0) {
            uVar11 = uVar19 << 4 | 8;
            local_38 = local_68 + uVar19;
            uVar18 = 0;
            local_58 = uVar17;
            local_50 = uVar16;
            do {
              if ((uVar16 >> (uVar18 & 0x3f) & 1) != 0) {
                uVar3 = *(undefined8 *)((long)ldata + (uVar11 - 8));
                iVar13 = *(int64_t *)((long)&ldata->months + uVar11);
                dVar1 = local_38[uVar18];
                if ((dVar1 != 0.0) || (NAN(dVar1))) {
                  left.micros = iVar13;
                  left.months = (int)uVar3;
                  left.days = (int)((ulong)uVar3 >> 0x20);
                  iVar20 = DivideOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                                     (left,dVar1);
                  uVar16 = local_50;
                  uVar17 = local_58;
                }
                else {
                  _Var9._M_head_impl =
                       (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
                  if (_Var9._M_head_impl == (unsigned_long *)0x0) {
                    local_88 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                    local_40 = iVar13;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)&local_98,&local_88);
                    p_Var7 = p_Stack_90;
                    peVar6 = local_98;
                    local_98 = (element_type *)0x0;
                    p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                             internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = peVar6;
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = p_Var7;
                    if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                       (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
                       p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                    }
                    pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                             operator->(local_48);
                    _Var9._M_head_impl =
                         (pTVar8->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                         _Var9._M_head_impl;
                    iVar13 = local_40;
                    uVar16 = local_50;
                    uVar17 = local_58;
                    result_data = local_70;
                  }
                  iVar20.micros = iVar13;
                  iVar20.months = (int)uVar3;
                  iVar20.days = (int)((ulong)uVar3 >> 0x20);
                  bVar5 = (byte)(uVar19 + uVar18) & 0x3f;
                  _Var9._M_head_impl[uVar19 + uVar18 >> 6] =
                       _Var9._M_head_impl[uVar19 + uVar18 >> 6] &
                       (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
                }
                *(long *)((long)result_data + (uVar11 - 8)) = iVar20._0_8_;
                *(int64_t *)((long)&result_data->months + uVar11) = iVar20.micros;
              }
              uVar18 = uVar18 + 1;
              uVar11 = uVar11 + 0x10;
              count = local_78;
              uVar10 = local_60;
              uVar15 = uVar14;
            } while (uVar17 != uVar18);
          }
        }
      }
      local_80 = local_80 + 1;
      uVar19 = uVar15;
    } while (local_80 != uVar10);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}